

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O1

FT_Error ps_parser_load_field_table
                   (PS_Parser parser,T1_Field field,void **objects,FT_UInt max_objects,
                   FT_ULong *pflags)

{
  FT_Byte *pFVar1;
  FT_Byte *pFVar2;
  bool bVar3;
  FT_Error FVar4;
  T1_Token tokens;
  uint uVar5;
  undefined1 local_388 [8];
  T1_TokenRec elements [32];
  T1_FieldRec fieldrec;
  uint local_34;
  
  elements[0x1f]._16_8_ = field->ident;
  tokens = (T1_Token)local_388;
  ps_parser_to_token_array(parser,tokens,0x20,(FT_Int *)&local_34);
  if ((int)local_34 < 0) {
    FVar4 = 0xa2;
  }
  else {
    if (field->array_max < local_34) {
      local_34 = field->array_max;
    }
    pFVar1 = parser->cursor;
    pFVar2 = parser->limit;
    if ((field->type != T1_FIELD_TYPE_BBOX) && ((ulong)field->count_offset != 0)) {
      *(undefined1 *)((long)*objects + (ulong)field->count_offset) = (undefined1)local_34;
    }
    uVar5 = local_34;
    if ((int)local_34 < 1) {
      FVar4 = 0;
    }
    else {
      do {
        parser->cursor = tokens->start;
        parser->limit = tokens->limit;
        FVar4 = ps_parser_load_field
                          (parser,(T1_Field)&elements[0x1f].type,objects,max_objects,pflags);
        if (FVar4 != 0) goto LAB_002098d0;
        tokens = tokens + 1;
        bVar3 = 1 < (int)uVar5;
        uVar5 = uVar5 - 1;
      } while (bVar3);
      FVar4 = 0;
    }
LAB_002098d0:
    parser->cursor = pFVar1;
    parser->limit = pFVar2;
  }
  return FVar4;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  ps_parser_load_field_table( PS_Parser       parser,
                              const T1_Field  field,
                              void**          objects,
                              FT_UInt         max_objects,
                              FT_ULong*       pflags )
  {
    T1_TokenRec  elements[T1_MAX_TABLE_ELEMENTS];
    T1_Token     token;
    FT_Int       num_elements;
    FT_Error     error = FT_Err_Ok;
    FT_Byte*     old_cursor;
    FT_Byte*     old_limit;
    T1_FieldRec  fieldrec = *(T1_Field)field;


    fieldrec.type = T1_FIELD_TYPE_INTEGER;
    if ( field->type == T1_FIELD_TYPE_FIXED_ARRAY ||
         field->type == T1_FIELD_TYPE_BBOX        )
      fieldrec.type = T1_FIELD_TYPE_FIXED;

    ps_parser_to_token_array( parser, elements,
                              T1_MAX_TABLE_ELEMENTS, &num_elements );
    if ( num_elements < 0 )
    {
      error = FT_ERR( Ignore );
      goto Exit;
    }
    if ( (FT_UInt)num_elements > field->array_max )
      num_elements = (FT_Int)field->array_max;

    old_cursor = parser->cursor;
    old_limit  = parser->limit;

    /* we store the elements count if necessary;           */
    /* we further assume that `count_offset' can't be zero */
    if ( field->type != T1_FIELD_TYPE_BBOX && field->count_offset != 0 )
      *(FT_Byte*)( (FT_Byte*)objects[0] + field->count_offset ) =
        (FT_Byte)num_elements;

    /* we now load each element, adjusting the field.offset on each one */
    token = elements;
    for ( ; num_elements > 0; num_elements--, token++ )
    {
      parser->cursor = token->start;
      parser->limit  = token->limit;

      error = ps_parser_load_field( parser,
                                    &fieldrec,
                                    objects,
                                    max_objects,
                                    0 );
      if ( error )
        break;

      fieldrec.offset += fieldrec.size;
    }

#if 0  /* obsolete -- keep for reference */
    if ( pflags )
      *pflags |= 1L << field->flag_bit;
#else
    FT_UNUSED( pflags );
#endif

    parser->cursor = old_cursor;
    parser->limit  = old_limit;

  Exit:
    return error;
  }